

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestHandler *this,cmCTestTestProperties *it)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  iterator l;
  pointer pbVar4;
  
  if ((this->UseExcludeLabelRegExpFlag == true) &&
     (pbVar4 = (it->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pbVar4 != (it->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = 0;
    do {
      bVar3 = bVar1;
      bVar2 = cmsys::RegularExpression::find
                        (&this->ExcludeLabelRegularExpression,(pbVar4->_M_dataplus)._M_p);
      pbVar4 = pbVar4 + 1;
      bVar1 = bVar3 | bVar2;
    } while (pbVar4 != (it->Labels).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar3 != 0 || bVar2) {
      it->IsInBasedOnREOptions = false;
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestProperties& it)
{
  // if not using Labels to filter then return
  if (!this->UseExcludeLabelRegExpFlag) {
    return;
  }
  // if there are no labels and we are excluding by labels
  // then do nothing as a no label can not be a match
  if (it.Labels.empty()) {
    return;
  }
  // check to see if the label regular expression matches
  bool found = false; // assume it does not match
  // loop over all labels and look for match
  for (std::vector<std::string>::iterator l = it.Labels.begin();
       l != it.Labels.end(); ++l) {
    if (this->ExcludeLabelRegularExpression.find(*l)) {
      found = true;
    }
  }
  // if match was found, exclude the test
  if (found) {
    it.IsInBasedOnREOptions = false;
  }
}